

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void __thiscall PosixRunWriter::~PosixRunWriter(PosixRunWriter *this)

{
  pointer puVar1;
  
  puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    spdlog::error<char[46]>((char (*) [46])"PosixRunWriter not flushed before destructing");
    std::terminate();
  }
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->buffer_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

PosixRunWriter::~PosixRunWriter() {
    if (!buffer_.empty()) {
        // PosixRunWriter buffer not flushed, fatal error.
        spdlog::error("PosixRunWriter not flushed before destructing");
        std::terminate();
    }
}